

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O0

void __thiscall BatchResultValues::~BatchResultValues(BatchResultValues *this)

{
  CaseValues *this_00;
  bool bVar1;
  reference ppCVar2;
  __normal_iterator<CaseValues_**,_std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>_>
  local_20;
  __normal_iterator<CaseValues_**,_std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>_>
  local_18;
  iterator i;
  BatchResultValues *this_local;
  
  i._M_current = (CaseValues **)this;
  local_18._M_current =
       (CaseValues **)
       std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>::begin(&this->m_caseValues);
  while( true ) {
    local_20._M_current =
         (CaseValues **)
         std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>::end(&this->m_caseValues);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<CaseValues_**,_std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppCVar2;
    if (this_00 != (CaseValues *)0x0) {
      CaseValues::~CaseValues(this_00);
      operator_delete(this_00,0x60);
    }
    __gnu_cxx::
    __normal_iterator<CaseValues_**,_std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>_>::
    operator++(&local_18);
  }
  std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>::~vector(&this->m_caseValues);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_tagNames);
  return;
}

Assistant:

~BatchResultValues (void)
	{
		for (vector<CaseValues*>::iterator i = m_caseValues.begin(); i != m_caseValues.end(); ++i)
			delete *i;
	}